

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::pathChanged(QFileDialogPrivate *this,QString *newPath)

{
  QList<QFileDialogPrivate::HistoryItem> *this_00;
  long lVar1;
  QWidget *this_01;
  QSidebar *this_02;
  QFileDialogComboBox *pQVar2;
  long lVar3;
  Data *pDVar4;
  bool enable;
  byte bVar5;
  int iVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  HistoryItem local_b8;
  HistoryItem local_88;
  QArrayData *local_58;
  storage_type_conflict *psStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  this_01 = (QWidget *)((this->qFileDialogUi).d)->toParentButton;
  QFileSystemModel::rootPath();
  enable = (bool)QFileInfo::exists((QString *)&local_88);
  QWidget::setEnabled(this_01,enable);
  if (&(local_88.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.path.d.d)->super_QArrayData,2,0x10);
    }
  }
  this_02 = ((this->qFileDialogUi).d)->sidebar;
  QUrl::fromLocalFile((QString *)&local_88);
  QSidebar::selectUrl(this_02,(QUrl *)&local_88);
  QUrl::~QUrl((QUrl *)&local_88);
  pQVar2 = ((this->qFileDialogUi).d)->lookInCombo;
  local_88.path.d.d = (Data *)(pQVar2->m_history).d.d;
  local_88.path.d.ptr = (char16_t *)(pQVar2->m_history).d.ptr;
  local_88.path.d.size = (pQVar2->m_history).d.size;
  if ((QArrayData *)local_88.path.d.d != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((QArrayData *)local_88.path.d.d)->ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((QArrayData *)local_88.path.d.d)->ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lVar1 = *(long *)(lVar1 + 8);
  lVar3 = *(long *)(lVar1 + 0x370);
  if (lVar3 != 0 && *(char *)(lVar1 + 0x2c8) == '\0') {
    QFileDialogComboBox::setHistory
              (*(QFileDialogComboBox **)(lVar3 + 0x18),(QStringList *)&local_88);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_88);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  psStack_50 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  QDir::toNativeSeparators((QString *)&local_58);
  iVar6 = this->currentHistoryLocation;
  bVar5 = 1;
  if (-1 < (long)iVar6) {
    QList<QFileDialogPrivate::HistoryItem>::value(&local_88,&this->currentHistory,(long)iVar6);
    if ((undefined1 *)local_88.path.d.size == local_48) {
      QVar7.m_data = local_88.path.d.ptr;
      QVar7.m_size = local_88.path.d.size;
      QVar8.m_data = psStack_50;
      QVar8.m_size = (qsizetype)local_48;
      bVar5 = QtPrivate::equalStrings(QVar7,QVar8);
      bVar5 = bVar5 ^ 1;
    }
  }
  if (-1 < iVar6) {
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_88.selection.d);
    if (&(local_88.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_88.path.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (bVar5 != 0) {
    if (-1 < this->currentHistoryLocation) {
      saveHistorySelection(this);
    }
    iVar6 = this->currentHistoryLocation;
    if (-1 < iVar6) {
      this_00 = &this->currentHistory;
      do {
        if ((ulong)(this->currentHistory).d.size <= (ulong)(iVar6 + 1)) break;
        pDVar4 = (this_00->d).d;
        if ((pDVar4 == (Data *)0x0) ||
           (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QArrayDataPointer<QFileDialogPrivate::HistoryItem>::reallocateAndGrow
                    (&this_00->d,GrowsAtEnd,0,
                     (QArrayDataPointer<QFileDialogPrivate::HistoryItem> *)0x0);
        }
        QtPrivate::QGenericArrayOps<QFileDialogPrivate::HistoryItem>::eraseLast
                  ((QGenericArrayOps<QFileDialogPrivate::HistoryItem> *)this_00);
        iVar6 = this->currentHistoryLocation;
      } while (-1 < iVar6);
    }
    local_b8.path.d.d = (Data *)local_58;
    local_b8.path.d.ptr = psStack_50;
    local_b8.path.d.size = (qsizetype)local_48;
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_b8.selection.d.d = (Data *)0x0;
    local_b8.selection.d.ptr = (QPersistentModelIndex *)0x0;
    local_b8.selection.d.size = 0;
    QtPrivate::QGenericArrayOps<QFileDialogPrivate::HistoryItem>::
    emplace<QFileDialogPrivate::HistoryItem>
              ((QGenericArrayOps<QFileDialogPrivate::HistoryItem> *)&this->currentHistory,
               (this->currentHistory).d.size,&local_b8);
    QList<QFileDialogPrivate::HistoryItem>::end(&this->currentHistory);
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_b8.selection.d);
    if (&(local_b8.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_b8.path.d.d)->super_QArrayData,2,0x10);
      }
    }
    this->currentHistoryLocation = this->currentHistoryLocation + 1;
  }
  QWidget::setEnabled((QWidget *)((this->qFileDialogUi).d)->forwardButton,
                      1 < (this->currentHistory).d.size - (long)this->currentHistoryLocation);
  QWidget::setEnabled((QWidget *)((this->qFileDialogUi).d)->backButton,
                      0 < this->currentHistoryLocation);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::pathChanged(const QString &newPath)
{
    Q_Q(QFileDialog);
    qFileDialogUi->toParentButton->setEnabled(QFileInfo::exists(model->rootPath()));
    qFileDialogUi->sidebar->selectUrl(QUrl::fromLocalFile(newPath));
    q->setHistory(qFileDialogUi->lookInCombo->history());

    const QString newNativePath = QDir::toNativeSeparators(newPath);

    // equal paths indicate this was invoked by _q_navigateBack/Forward()
    if (currentHistoryLocation < 0 || currentHistory.value(currentHistoryLocation).path != newNativePath) {
        if (currentHistoryLocation >= 0)
            saveHistorySelection();
        while (currentHistoryLocation >= 0 && currentHistoryLocation + 1 < currentHistory.size()) {
            currentHistory.removeLast();
        }
        currentHistory.append({newNativePath, PersistentModelIndexList()});
        ++currentHistoryLocation;
    }
    qFileDialogUi->forwardButton->setEnabled(currentHistory.size() - currentHistoryLocation > 1);
    qFileDialogUi->backButton->setEnabled(currentHistoryLocation > 0);
}